

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O2

populator_set * __thiscall
spdlog::populators::
make_populator_set<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
          (populator_set *__return_storage_ptr__,populators *this,
          unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
          *args,unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                *args_1,
          unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
          *args_2,unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
                  *args_3)

{
  _Head_base<0UL,_spdlog::populators::thread_id_populator_*,_false> local_40;
  _Head_base<0UL,_spdlog::populators::level_populator_*,_false> local_38;
  _Head_base<0UL,_spdlog::populators::date_time_populator_*,_false> local_30;
  _Head_base<0UL,_spdlog::populators::populator_*,_false> local_28;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_28._M_head_impl = *(populator **)this;
  *(undefined8 *)this = 0;
  std::__detail::
  _Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)__return_storage_ptr__,(value_type *)&local_28);
  local_30._M_head_impl =
       (args->_M_t).
       super___uniq_ptr_impl<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
       ._M_t.
       super__Tuple_impl<0UL,_spdlog::populators::date_time_populator_*,_std::default_delete<spdlog::populators::date_time_populator>_>
       .super__Head_base<0UL,_spdlog::populators::date_time_populator_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::date_time_populator_*,_std::default_delete<spdlog::populators::date_time_populator>_>
  .super__Head_base<0UL,_spdlog::populators::date_time_populator_*,_false>._M_head_impl =
       (date_time_populator *)0x0;
  std::__detail::
  _Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)__return_storage_ptr__,(value_type *)&local_30);
  local_38._M_head_impl =
       (args_1->_M_t).
       super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
       ._M_t.
       super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
       .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>._M_head_impl;
  (args_1->_M_t).
  super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
  .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>._M_head_impl =
       (level_populator *)0x0;
  std::__detail::
  _Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)__return_storage_ptr__,(value_type *)&local_38);
  local_40._M_head_impl =
       (args_2->_M_t).
       super___uniq_ptr_impl<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
       ._M_t.
       super__Tuple_impl<0UL,_spdlog::populators::thread_id_populator_*,_std::default_delete<spdlog::populators::thread_id_populator>_>
       .super__Head_base<0UL,_spdlog::populators::thread_id_populator_*,_false>._M_head_impl;
  (args_2->_M_t).
  super___uniq_ptr_impl<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::thread_id_populator_*,_std::default_delete<spdlog::populators::thread_id_populator>_>
  .super__Head_base<0UL,_spdlog::populators::thread_id_populator_*,_false>._M_head_impl =
       (thread_id_populator *)0x0;
  std::__detail::
  _Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)__return_storage_ptr__,(value_type *)&local_40);
  if (local_40._M_head_impl != (thread_id_populator *)0x0) {
    (*((local_40._M_head_impl)->super_populator)._vptr_populator[1])();
  }
  if (local_38._M_head_impl != (level_populator *)0x0) {
    (*((local_38._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  if (local_30._M_head_impl != (date_time_populator *)0x0) {
    (*((local_30._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  if (local_28._M_head_impl != (populator *)0x0) {
    (*(local_28._M_head_impl)->_vptr_populator[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

populator_set make_populator_set(Args &&... args)
{
    populator_set ret;
    int dummy[] = {(ret.insert(std::move(std::forward<Args>(args))), 0)...};
    (void)dummy;
    return ret;
}